

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O1

bool __thiscall pg::PTLSolver::search(PTLSolver *this,bitset *R,int top,int player)

{
  uint v;
  Game *pGVar1;
  uint64_t *puVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  size_t sVar8;
  bool bVar9;
  uint vtop;
  uint __len;
  uint uVar10;
  size_t sVar11;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  bitset Z;
  string __str;
  bitset local_88;
  _label_vertex local_68;
  long local_58;
  int *local_48;
  string *local_40;
  ulong local_38;
  
  local_88._size = ((this->super_Solver).game)->n_vertices;
  uVar16 = local_88._size + 0x3f;
  local_88._bitssize = uVar16 >> 6;
  uVar14 = local_88._bitssize << 3;
  local_88._allocsize = uVar14;
  local_88._bits = (uint64_t *)operator_new__(uVar14);
  if (0x3f < uVar16) {
    memset(local_88._bits,0,uVar14);
  }
  if (top == -1) {
    bVar9 = false;
  }
  else {
    local_40 = (string *)&this->path;
    uVar14 = (ulong)top;
    bVar9 = false;
    do {
      uVar16 = uVar14 >> 6;
      if ((R->_bits[uVar16] >> (uVar14 & 0x3f) & 1) != 0) {
        local_38 = 1L << (uVar14 & 0x3f);
        uVar15 = ((this->super_Solver).game)->_priority[uVar14];
        local_48 = (int *)(ulong)uVar15;
        uVar15 = uVar15 & 1;
        local_88._bits[uVar16] = local_88._bits[uVar16] | local_38;
        this->str[uVar14] = -1;
        iVar5 = (this->Q).pointer;
        (this->Q).pointer = iVar5 + 1;
        vtop = (uint)uVar14;
        (this->Q).queue[iVar5] = vtop;
        iVar5 = (this->Q).pointer;
        if (iVar5 != 0) {
          do {
            (this->Q).pointer = iVar5 + -1;
            v = (this->Q).queue[(long)iVar5 + -1];
            attractVertices(this,uVar15,v,R,&local_88,R);
            if ((uVar15 ^ player) != 1) {
              attractTangles(this,uVar15,v,R,&local_88,R);
            }
            iVar5 = (this->Q).pointer;
          } while (iVar5 != 0);
        }
        if (1 < (this->super_Solver).trace) {
          poVar7 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\x1b[1;33mregion\x1b[m \x1b[1;36m",0x18);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m",3);
          for (sVar8 = bitset::find_first(&local_88); sVar8 != 0xffffffffffffffff;
              sVar8 = bitset::find_next(&local_88,sVar8)) {
            poVar7 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," \x1b[1;38;5;15m",0xd);
            local_68.g = (this->super_Solver).game;
            local_68.v = (int)sVar8;
            poVar7 = operator<<(poVar7,&local_68);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[m",3);
            if (this->str[sVar8] != -1) {
              poVar7 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"->",2);
              local_68.g = (this->super_Solver).game;
              local_68.v = this->str[sVar8];
              operator<<(poVar7,&local_68);
            }
          }
          poVar7 = (this->super_Solver).logger;
          cVar3 = (char)poVar7;
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
        }
        if ((player == -1) || (uVar15 == player)) {
          pGVar1 = (this->super_Solver).game;
          uVar13 = (uint)local_48;
          if ((((pGVar1->_owner)._bits[uVar16] & local_38) == 0) == (bool)((byte)local_48 & 1)) {
            uVar10 = pGVar1->_outedges[pGVar1->_firstouts[uVar14]];
            bVar17 = uVar10 == 0xffffffff;
            if (!bVar17) {
              puVar12 = (uint *)(pGVar1->_outedges + (long)pGVar1->_firstouts[uVar14] + 1);
              do {
                if (((local_88._bits[(ulong)(long)(int)uVar10 >> 6] >> ((ulong)uVar10 & 0x3f) & 1)
                     == 0) &&
                   ((R->_bits[(ulong)(long)(int)uVar10 >> 6] & 1L << ((ulong)uVar10 & 0x3f)) != 0))
                goto LAB_0017ad11;
                uVar10 = *puVar12;
                puVar12 = puVar12 + 1;
                bVar17 = uVar10 == 0xffffffff;
              } while (!bVar17);
            }
          }
          else {
            bVar17 = this->str[uVar14] != -1;
          }
          if (bVar17) {
            memset(this->pea_vidx,0,pGVar1->n_vertices << 2);
            this->pea_curidx = 1;
            bVar17 = extractTangles(this,vtop,&local_88,this->str);
          }
          else {
LAB_0017ad11:
            uVar10 = -uVar13;
            if (0 < (int)uVar13) {
              uVar10 = uVar13;
            }
            __len = 1;
            if (9 < uVar10) {
              uVar16 = (ulong)uVar10;
              uVar4 = 4;
              do {
                __len = uVar4;
                uVar6 = (uint)uVar16;
                if (uVar6 < 100) {
                  __len = __len - 2;
                  goto LAB_0017ad6a;
                }
                if (uVar6 < 1000) {
                  __len = __len - 1;
                  goto LAB_0017ad6a;
                }
                if (uVar6 < 10000) goto LAB_0017ad6a;
                uVar16 = uVar16 / 10000;
                uVar4 = __len + 4;
              } while (99999 < uVar6);
              __len = __len + 1;
            }
LAB_0017ad6a:
            local_68.g = (Game *)&stack0xffffffffffffffa8;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_68,(char)__len - ((char)((ulong)local_48 >> 0x18) >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((long)&(local_68.g)->n_vertices + (ulong)(uVar13 >> 0x1f)),__len,
                       uVar10);
            std::__cxx11::string::operator=(local_40,(string *)&local_68);
            if (local_68.g != (Game *)&stack0xffffffffffffffa8) {
              operator_delete(local_68.g,local_58 + 1);
            }
            bVar17 = search_rec(this,&local_88,vtop,uVar15,R);
          }
          bVar9 = (bool)(bVar9 | bVar17);
        }
        sVar8 = R->_bitssize;
        if (sVar8 != 0) {
          puVar2 = R->_bits;
          sVar11 = 0;
          do {
            puVar2[sVar11] = puVar2[sVar11] & ~local_88._bits[sVar11];
            sVar11 = sVar11 + 1;
          } while (sVar8 != sVar11);
        }
        if (local_88._bitssize != 0) {
          memset(local_88._bits,0,local_88._bitssize << 3);
        }
      }
      bVar17 = uVar14 != 0;
      uVar14 = uVar14 - 1;
    } while (bVar17);
  }
  if (local_88._bits != (uint64_t *)0x0) {
    operator_delete__(local_88._bits);
  }
  return bVar9;
}

Assistant:

bool
PTLSolver::search(bitset &R, int top, int player)
{
    bool changes = false;

    bitset Z(nodecount());

    // Partition the game <R>

    for (; top!=-1; top--) {
        // find next top
        if (!R[top]) continue;

        const int pr = priority(top);
        const int pl = priority(top)&1;

        Z[top] = true; // add to <Z>
        str[top] = -1;
        Q.push(top);

        while (Q.nonempty()) {
            const int v = Q.pop();
            /*/ R[v] = false; // remove from <R> */
            attractVertices(pl, v, R, Z, R);
            // attract tangles if correct player, or <player> equals -1
            if ((1-pl) != player) attractTangles(pl, v, R, Z, R);
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m \033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        if (player == -1 or pl == player) {
            /**
             * Now Z is the current region and <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Check if Z is locally closed by looking at <top>.
             */

            if (owner(top) == pl) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and R[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

               // initialize path (for trace output) to <pr>
               path = std::to_string(pr);
               changes |= search_rec(Z, top, pl, R);
            }
        }

        R -= Z;
        Z.reset();
    }

    return changes;
}